

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void int_linear(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  IntVar *pIVar6;
  ulong uVar7;
  IntVar *pIVar8;
  int c_00;
  double dVar9;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  c_00 = -c;
  iVar3 = c;
  if (c < 1) {
    iVar3 = c_00;
  }
  dVar9 = (double)iVar3;
  uVar4 = (ulong)x->sz;
  if (uVar4 == 0) {
    bVar1 = false;
  }
  else {
    uVar7 = 0;
    bVar2 = false;
    do {
      bVar1 = true;
      if (a->data[uVar7] == -1) {
        bVar1 = bVar2;
      }
      if (a->data[uVar7] == 1) {
        bVar1 = bVar2;
      }
      dVar9 = dVar9 + 2147483647.0;
      uVar7 = uVar7 + 1;
      bVar2 = bVar1;
    } while (uVar4 != uVar7);
  }
  if (9.223372036854776e+18 <= dVar9) {
    int_linear();
  }
  if (uVar4 == 2) {
    if (!bVar1) {
      piVar5 = a->data;
      iVar3 = *piVar5;
      if ((uint)r->s * -2 + 1 == (int)sat.assigns.data[(uint)r->v]) {
        if (iVar3 == 1) {
          if (piVar5[1] == -1) {
            pIVar8 = *x->data;
            pIVar6 = x->data[1];
LAB_001a5492:
            int_rel(pIVar8,t,pIVar6,c);
            return;
          }
          if (t != IRT_NE && piVar5[1] == 1) {
            pIVar6 = *x->data;
            pIVar8 = x->data[1];
            c_00 = c;
            goto LAB_001a545e;
          }
        }
        else if (iVar3 == -1) {
          if (t != IRT_NE && piVar5[1] == -1) {
            pIVar6 = *x->data;
            pIVar8 = x->data[1];
            if (t - IRT_LE < 4) {
              t = *(IntRelType *)(&DAT_001d64b0 + (ulong)(t - IRT_LE) * 4);
            }
LAB_001a545e:
            bin_linear(pIVar6,pIVar8,t,c_00);
            return;
          }
          if (piVar5[1] == 1) {
            pIVar6 = *x->data;
            pIVar8 = x->data[1];
            goto LAB_001a5492;
          }
        }
      }
      else if (iVar3 + piVar5[1] == 0) {
        if (piVar5[1] == -1 && iVar3 == 1) {
          int_rel_reif(*x->data,t,x->data[1],r,c);
          piVar5 = a->data;
          iVar3 = *piVar5;
        }
        if (iVar3 != -1) {
          return;
        }
        if (piVar5[1] != 1) {
          return;
        }
        int_rel_reif(x->data[1],t,*x->data,r,c);
        return;
      }
    }
  }
  else if ((x->sz == 1) && (!bVar1)) {
    iVar3 = *a->data;
    if ((uint)r->s * -2 + 1 != (int)sat.assigns.data[(uint)r->v]) {
      if (iVar3 == 1) {
        local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
        local_40.v = r->v;
        local_40.s = r->s;
        int_rel_reif(*x->data,t,c,&local_40);
        iVar3 = *a->data;
      }
      if (iVar3 != -1) {
        return;
      }
      if (t - IRT_LE < 4) {
        t = *(IntRelType *)(&DAT_001d64b0 + (ulong)(t - IRT_LE) * 4);
      }
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_50.v = r->v;
      local_50.s = r->s;
      int_rel_reif(*x->data,t,c_00,&local_50);
      return;
    }
    if (iVar3 == 1) {
      int_rel(*x->data,t,c);
      iVar3 = *a->data;
    }
    if (iVar3 != -1) {
      return;
    }
    if (t - IRT_LE < 4) {
      t = *(IntRelType *)(&DAT_001d64b0 + (ulong)(t - IRT_LE) * 4);
    }
    int_rel(*x->data,t,c_00);
    return;
  }
  if ((uint)r->s * -2 + 1 != (int)sat.assigns.data[(uint)r->v]) {
    if (bVar1) {
      local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_60.v = r->v;
      local_60.s = r->s;
      int_linear_reif<1>(a,x,t,c,&local_60);
    }
    else {
      local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_70.v = r->v;
      local_70.s = r->s;
      int_linear_reif<0>(a,x,t,c,&local_70);
    }
    return;
  }
  if (bVar1) {
    int_linear<1>(a,x,t,c);
    return;
  }
  int_linear<0>(a,x,t,c);
  return;
}

Assistant:

void int_linear(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, const BoolView& r) {
	assert(a.size() == x.size());

	bool scale = false;
	double limit = abs(c);
	for (unsigned int i = 0; i < x.size(); i++) {
		assert(a[i]);
		if (a[i] != 1 && a[i] != -1) {
			scale = true;
		}
		limit += abs(a[i]) * IntVar::max_limit + INT_MAX;
	}
	if (limit >= INT64_MAX) {
		CHUFFED_ERROR("Linear constraint may overflow, not yet supported\n");
	}

	if (x.size() == 1 && !scale) {
		if (r.isTrue()) {
			if (a[0] == 1) {
				int_rel(x[0], t, c);
			}
			if (a[0] == -1) {
				int_rel(x[0], -t, -c);
			}
		} else {
			if (a[0] == 1) {
				int_rel_reif(x[0], t, c, r);
			}
			if (a[0] == -1) {
				int_rel_reif(x[0], -t, -c, r);
			}
		}
		return;
	}

	if (x.size() == 2 && !scale) {
		if (r.isTrue()) {
			if (a[0] == -1 && a[1] == -1 && t != IRT_NE) {
				bin_linear(x[0], x[1], -t, -c);
				return;
			}
			if (a[0] == 1 && a[1] == -1) {
				int_rel(x[0], t, x[1], c);
				return;
			}
			if (a[0] == -1 && a[1] == 1) {
				int_rel(x[1], t, x[0], c);
				return;
			}
			if (a[0] == 1 && a[1] == 1 && t != IRT_NE) {
				bin_linear(x[0], x[1], t, c);
				return;
			}
		} else if (a[0] + a[1] == 0) {
			if (a[0] == 1 && a[1] == -1) {
				int_rel_reif(x[0], t, x[1], r, c);
			}
			if (a[0] == -1 && a[1] == 1) {
				int_rel_reif(x[1], t, x[0], r, c);
			}
			return;
		}
	}

	if (r.isTrue()) {
		if (scale) {
			int_linear<1>(a, x, t, c);
		} else {
			int_linear<0>(a, x, t, c);
		}
	} else {
		if (scale) {
			int_linear_reif<1>(a, x, t, c, r);
		} else {
			int_linear_reif<0>(a, x, t, c, r);
		}
	}
}